

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void createRandomTapes(randomTape_t *tapes,uint8_t *seeds,uint8_t *salt,size_t t,
                      picnic_instance_t *params)

{
  uint8_t **ppuVar1;
  byte bVar2;
  ulong size;
  ulong uVar3;
  uint16_t i_arr [4];
  uint8_t *local_388;
  uint8_t *puStack_380;
  uint8_t *puStack_378;
  uint8_t *puStack_370;
  hash_context_x4 ctx;
  
  bVar2 = params->view_size;
  allocateRandomTape(tapes,params);
  for (uVar3 = 0; uVar3 < params->num_MPC_parties; uVar3 = uVar3 + 4) {
    hash_init_x4(&ctx,(ulong)params->digest_size);
    size = (ulong)params->seed_size;
    hash_update_x4_4(&ctx,seeds + uVar3 * size,seeds + (uVar3 + 1) * size,seeds + (uVar3 + 2) * size
                     ,seeds + (uVar3 + 3) * size,size);
    hash_update_x4_1(&ctx,salt,0x20);
    hash_update_x4_uint16_le(&ctx,(uint16_t)t);
    i_arr[1] = (uint16_t)(uVar3 + 1);
    i_arr[2] = i_arr[1] + 1;
    i_arr[0] = (uint16_t)uVar3;
    i_arr[3] = i_arr[1] + 2;
    hash_update_x4_uint16s_le(&ctx,i_arr);
    hash_final_x4(&ctx);
    ppuVar1 = tapes->tape + uVar3;
    local_388 = *ppuVar1;
    puStack_380 = ppuVar1[1];
    puStack_378 = ppuVar1[2];
    puStack_370 = ppuVar1[3];
    hash_squeeze_x4(&ctx,&local_388,(ulong)((uint)bVar2 * 2));
  }
  return;
}

Assistant:

static void createRandomTapes(randomTape_t* tapes, uint8_t* seeds, uint8_t* salt, size_t t,
                              const picnic_instance_t* params) {
  hash_context_x4 ctx;

  size_t tapeSizeBytes = 2 * params->view_size;

  allocateRandomTape(tapes, params);
  assert(params->num_MPC_parties % 4 == 0);
  for (size_t i = 0; i < params->num_MPC_parties; i += 4) {
    hash_init_x4(&ctx, params->digest_size);

    hash_update_x4_4(&ctx, &seeds[i * params->seed_size], &seeds[(i + 1) * params->seed_size],
                     &seeds[(i + 2) * params->seed_size], &seeds[(i + 3) * params->seed_size],
                     params->seed_size);
    hash_update_x4_1(&ctx, salt, SALT_SIZE);
    hash_update_x4_uint16_le(&ctx, t);
    const uint16_t i_arr[4] = {i + 0, i + 1, i + 2, i + 3};
    hash_update_x4_uint16s_le(&ctx, i_arr);
    hash_final_x4(&ctx);

    hash_squeeze_x4_4(&ctx, tapes->tape[i], tapes->tape[i + 1], tapes->tape[i + 2],
                      tapes->tape[i + 3], tapeSizeBytes);
    hash_clear_x4(&ctx);
  }
}